

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O1

char * Wlc_PrsReadConstant(Wlc_Prs_t *p,char *pStr,Vec_Int_t *vFanins,int *pRange,int *pSigned,
                          int *pXValue)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  ulong uVar7;
  char *pcVar8;
  char cVar9;
  byte bVar10;
  char cVar11;
  ulong uVar12;
  int iVar13;
  char *pcVar14;
  byte *pbVar15;
  bool bVar16;
  
  uVar4 = atoi(pStr);
  *pRange = -1;
  *pSigned = 0;
  *pXValue = 0;
  do {
    pcVar14 = pStr;
    cVar11 = *pcVar14;
    pStr = pcVar14 + 1;
  } while (cVar11 == ' ');
  if (cVar11 != '\0') {
    bVar1 = true;
    cVar9 = cVar11;
    do {
      if ((bool)(bVar1 & cVar9 == '\'')) {
        if (cVar11 != '\'') {
          bVar1 = true;
          do {
            bVar16 = cVar11 != '\\';
            bVar3 = cVar11 == ' ';
            if (!bVar16) {
              bVar3 = bVar16;
            }
            if (bVar1) {
              bVar3 = bVar16;
            }
            cVar11 = pcVar14[1];
            pcVar14 = pcVar14 + 1;
            bVar1 = bVar3;
          } while (cVar11 != '\'' || (bool)(~bVar3 & 1));
        }
        if (pcVar14[1] == 's') {
          pcVar14 = pcVar14 + 1;
          *pSigned = 1;
        }
        cVar11 = pcVar14[1];
        if (cVar11 != 'h') {
          if (cVar11 != 'b') {
            pcVar8 = "Expecting hexadecimal constant and not \"%c\".";
LAB_00378a1a:
            Wlc_PrsWriteErrorMessage(p,pcVar14,pcVar8,(ulong)(uint)(int)cVar11);
            return (char *)0x0;
          }
          uVar5 = (((int)uVar4 >> 5) + 1) - (uint)((uVar4 & 0x1f) == 0);
          if (vFanins->nCap < (int)uVar5) {
            if (vFanins->pArray == (int *)0x0) {
              piVar6 = (int *)malloc((long)(int)uVar5 << 2);
            }
            else {
              piVar6 = (int *)realloc(vFanins->pArray,(long)(int)uVar5 << 2);
            }
            vFanins->pArray = piVar6;
            if (piVar6 == (int *)0x0) goto LAB_00378c6b;
            vFanins->nCap = uVar5;
          }
          if (0 < (int)uVar5) {
            memset(vFanins->pArray,0,(ulong)uVar5 << 2);
          }
          vFanins->nSize = uVar5;
          if (0 < (int)uVar4) {
            uVar7 = 0;
            uVar5 = uVar4;
            do {
              uVar5 = uVar5 - 1;
              cVar11 = pcVar14[uVar7 + 2];
              if (cVar11 != '0') {
                if (cVar11 != '1') {
                  pcVar8 = "Wrong digit in binary constant \"%c\".";
                  goto LAB_00378a1a;
                }
                vFanins->pArray[(int)uVar5 >> 5] =
                     vFanins->pArray[(int)uVar5 >> 5] | 1 << ((byte)uVar5 & 0x1f);
              }
              uVar7 = uVar7 + 1;
            } while (uVar4 != uVar7);
          }
          *pRange = uVar4;
          return pcVar14 + (long)(int)uVar4 + 2;
        }
        *pXValue = (uint)((pcVar14[2] & 0xdfU) == 0x58);
        uVar5 = (((int)uVar4 >> 5) + 1) - (uint)((uVar4 & 0x1f) == 0);
        if ((int)uVar5 <= vFanins->nCap) {
LAB_00378b21:
          pbVar15 = (byte *)(pcVar14 + 2);
          if (0 < (int)uVar5) {
            memset(vFanins->pArray,0,(ulong)uVar5 << 2);
          }
          vFanins->nSize = uVar5;
          if ((0xf5 < (byte)(*pbVar15 - 0x3a)) ||
             (uVar7 = 0, 0xf9 < (byte)((*pbVar15 & 0xdf) + 0xb9))) {
            uVar7 = 0;
            do {
              do {
                lVar2 = uVar7 + 3;
                uVar7 = uVar7 + 1;
              } while (0xf5 < (byte)(pcVar14[lVar2] - 0x3aU));
            } while (0xf9 < (byte)((pcVar14[lVar2] & 0xdfU) + 0xb9));
          }
          if ((int)uVar7 != 0) {
            piVar6 = vFanins->pArray;
            pcVar14 = pcVar14 + (long)(int)uVar7 + 1;
            bVar10 = 0;
            uVar12 = 0;
            do {
              cVar11 = *pcVar14;
              iVar13 = -0x30;
              if (((9 < (byte)(cVar11 - 0x30U)) && (iVar13 = -0x37, 5 < (byte)(cVar11 + 0xbfU))) &&
                 (iVar13 = -0x57, 5 < (byte)(cVar11 + 0x9fU))) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                              ,0x4bf,"int Abc_TtReadHexDigit(char)");
              }
              *(ulong *)(piVar6 + (uVar12 >> 4 & 0xfffffff) * 2) =
                   *(ulong *)(piVar6 + (uVar12 >> 4 & 0xfffffff) * 2) |
                   (ulong)(uint)(iVar13 + cVar11) << (bVar10 & 0x3c);
              uVar12 = uVar12 + 1;
              bVar10 = bVar10 + 4;
              pcVar14 = pcVar14 + -1;
            } while ((uVar7 & 0xffffffff) != uVar12);
          }
          *pRange = uVar4;
          do {
            bVar10 = *pbVar15;
            if ((9 < (byte)(bVar10 - 0x30)) && (0x19 < (byte)((bVar10 & 0xdf) + 0xbf))) {
              if (0x3b < bVar10 - 0x24) {
                return (char *)pbVar15;
              }
              if ((0x900000000000001U >> ((ulong)(bVar10 - 0x24) & 0x3f) & 1) == 0) {
                return (char *)pbVar15;
              }
            }
            pbVar15 = pbVar15 + 1;
          } while( true );
        }
        if (vFanins->pArray == (int *)0x0) {
          piVar6 = (int *)malloc((long)(int)uVar5 << 2);
        }
        else {
          piVar6 = (int *)realloc(vFanins->pArray,(long)(int)uVar5 << 2);
        }
        vFanins->pArray = piVar6;
        if (piVar6 != (int *)0x0) {
          vFanins->nCap = uVar5;
          goto LAB_00378b21;
        }
        goto LAB_00378c6b;
      }
      bVar16 = cVar9 != '\\';
      bVar3 = cVar9 == ' ';
      if (!bVar16) {
        bVar3 = bVar16;
      }
      if (bVar1) {
        bVar3 = bVar16;
      }
      bVar1 = bVar3;
      cVar9 = *pStr;
      pStr = pStr + 1;
    } while (cVar9 != '\0');
  }
  uVar5 = atoi(pcVar14);
  uVar4 = uVar5 + 1;
  if (1 < uVar4) {
    if (uVar5 == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = (uVar4 ^ 0xffffffe0) + 0x21;
    }
  }
  *pRange = uVar4;
  if (0x1f < uVar4) {
    __assert_fail("*pRange < 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadVer.c"
                  ,0x24e,
                  "char *Wlc_PrsReadConstant(Wlc_Prs_t *, char *, Vec_Int_t *, int *, int *, int *)"
                 );
  }
  pcVar14 = pcVar14 + -1;
  do {
    pcVar8 = pcVar14 + 1;
    pcVar14 = pcVar14 + 1;
  } while (0xf5 < (byte)(*pcVar8 - 0x3aU));
  if (vFanins->nCap < 1) {
    if (vFanins->pArray == (int *)0x0) {
      piVar6 = (int *)malloc(4);
    }
    else {
      piVar6 = (int *)realloc(vFanins->pArray,4);
    }
    vFanins->pArray = piVar6;
    if (piVar6 == (int *)0x0) {
LAB_00378c6b:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vFanins->nCap = 1;
  }
  *vFanins->pArray = uVar5;
  vFanins->nSize = 1;
  return pcVar14;
}

Assistant:

static inline char * Wlc_PrsReadConstant( Wlc_Prs_t * p, char * pStr, Vec_Int_t * vFanins, int * pRange, int * pSigned, int * pXValue )
{
    int i, nDigits, nBits = atoi( pStr );
    *pRange = -1;
    *pSigned = 0;
    *pXValue = 0;
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( Wlc_PrsFindSymbol( pStr, '\'' ) == NULL )
    {
        // handle decimal number
        int Number = atoi( pStr );
        *pRange = Abc_Base2Log( Number+1 );
        assert( *pRange < 32 );
        while ( Wlc_PrsIsDigit(pStr) )
            pStr++;
        Vec_IntFill( vFanins, 1, Number );
        return pStr;
    }
    pStr = Wlc_PrsFindSymbol( pStr, '\'' );
    if ( pStr[1] == 's' )
    {
        *pSigned = 1;
        pStr++;
    }
    if ( pStr[1] == 'b' )
    {
        Vec_IntFill( vFanins, Abc_BitWordNum(nBits), 0 );
        for ( i = 0; i < nBits; i++ )
            if ( pStr[2+i] == '1' )
                Abc_InfoSetBit( (unsigned *)Vec_IntArray(vFanins), nBits-1-i );
            else if ( pStr[2+i] != '0' )
                return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "Wrong digit in binary constant \"%c\".", pStr[2+i] );
        *pRange = nBits;
        pStr += 2 + nBits;
        return pStr;
    }
    if ( pStr[1] != 'h' )
        return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "Expecting hexadecimal constant and not \"%c\".", pStr[1] );
    *pXValue = (pStr[2] == 'x' || pStr[2] == 'X');
    if ( *pXValue == 'X' )
        *pXValue = 'x';
    Vec_IntFill( vFanins, Abc_BitWordNum(nBits), 0 );
    nDigits = Abc_TtReadHexNumber( (word *)Vec_IntArray(vFanins), pStr+2 );
    if ( nDigits != (nBits + 3)/4 )
    {
//        return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "The length of a constant does not match." );
//        printf( "Warning: The length of a constant (%d hex digits) does not match the number of bits (%d).\n", nDigits, nBits );
    }
    *pRange = nBits;
    pStr += 2;
    while ( Wlc_PrsIsChar(pStr) )
        pStr++;
    return pStr;
}